

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_pmaddubsw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint16_t uVar1;
  int iVar2;
  
  iVar2 = (uint)d->_b_MMXReg[1] * (int)(char)s->_b_MMXReg[1] +
          (uint)d->_b_MMXReg[0] * (int)(char)s->_b_MMXReg[0];
  if (0x7ffe < iVar2) {
    iVar2 = 0x7fff;
  }
  uVar1 = (uint16_t)iVar2;
  if (iVar2 < -0x7fff) {
    uVar1 = 0x8000;
  }
  d->_w_MMXReg[0] = uVar1;
  iVar2 = (uint)d->_b_MMXReg[3] * (int)(char)s->_b_MMXReg[3] +
          (uint)d->_b_MMXReg[2] * (int)(char)s->_b_MMXReg[2];
  if (0x7ffe < iVar2) {
    iVar2 = 0x7fff;
  }
  uVar1 = (uint16_t)iVar2;
  if (iVar2 < -0x7fff) {
    uVar1 = 0x8000;
  }
  d->_w_MMXReg[1] = uVar1;
  iVar2 = (uint)d->_b_MMXReg[5] * (int)(char)s->_b_MMXReg[5] +
          (uint)d->_b_MMXReg[4] * (int)(char)s->_b_MMXReg[4];
  if (0x7ffe < iVar2) {
    iVar2 = 0x7fff;
  }
  uVar1 = (uint16_t)iVar2;
  if (iVar2 < -0x7fff) {
    uVar1 = 0x8000;
  }
  d->_w_MMXReg[2] = uVar1;
  iVar2 = (uint)d->_b_MMXReg[7] * (int)(char)s->_b_MMXReg[7] +
          (uint)d->_b_MMXReg[6] * (int)(char)s->_b_MMXReg[6];
  if (0x7ffe < iVar2) {
    iVar2 = 0x7fff;
  }
  uVar1 = (uint16_t)iVar2;
  if (iVar2 < -0x7fff) {
    uVar1 = 0x8000;
  }
  d->_w_MMXReg[3] = uVar1;
  return;
}

Assistant:

void glue(helper_pmaddubsw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    d->W(0) = satsw((int8_t)s->B(0) * (uint8_t)d->B(0) +
                    (int8_t)s->B(1) * (uint8_t)d->B(1));
    d->W(1) = satsw((int8_t)s->B(2) * (uint8_t)d->B(2) +
                    (int8_t)s->B(3) * (uint8_t)d->B(3));
    d->W(2) = satsw((int8_t)s->B(4) * (uint8_t)d->B(4) +
                    (int8_t)s->B(5) * (uint8_t)d->B(5));
    d->W(3) = satsw((int8_t)s->B(6) * (uint8_t)d->B(6) +
                    (int8_t)s->B(7) * (uint8_t)d->B(7));
#if SHIFT == 1
    d->W(4) = satsw((int8_t)s->B(8) * (uint8_t)d->B(8) +
                    (int8_t)s->B(9) * (uint8_t)d->B(9));
    d->W(5) = satsw((int8_t)s->B(10) * (uint8_t)d->B(10) +
                    (int8_t)s->B(11) * (uint8_t)d->B(11));
    d->W(6) = satsw((int8_t)s->B(12) * (uint8_t)d->B(12) +
                    (int8_t)s->B(13) * (uint8_t)d->B(13));
    d->W(7) = satsw((int8_t)s->B(14) * (uint8_t)d->B(14) +
                    (int8_t)s->B(15) * (uint8_t)d->B(15));
#endif
}